

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareFontTables.cpp
# Opt level: O0

void CompareFeatTables(int *ec,TestCase *ptcase,GrIStream *grstrmB,GrIStream *grstrmT,
                      byte *pNameTblB,byte *pNameTblT)

{
  ushort uVar1;
  ushort uVar2;
  short sVar3;
  short sVar4;
  int iVar5;
  int *piVar6;
  wchar_t *pwVar7;
  wchar_t *pwVar8;
  long *in_RCX;
  long *in_RDX;
  string *in_RSI;
  undefined8 in_RDI;
  wstring strT_1;
  wstring strB_1;
  uint nStrOffsetT_1;
  uint nStrOffsetB_1;
  int ifset;
  wstring strT;
  wstring strB;
  uint nStrOffsetT;
  uint nStrOffsetB;
  data16 cfsetThis;
  featid nIdT;
  featid nIdB;
  int ifeat;
  int cfset;
  int cfeatT;
  int cfeatB;
  int fxdVersionT;
  int fxdVersionB;
  GrIStream *in_stack_fffffffffffffc70;
  int in_stack_fffffffffffffcdc;
  allocator *in_stack_fffffffffffffce0;
  undefined8 in_stack_fffffffffffffce8;
  string *in_stack_fffffffffffffcf0;
  allocator *in_stack_fffffffffffffcf8;
  uint in_stack_fffffffffffffd00;
  int in_stack_fffffffffffffd04;
  allocator *in_stack_fffffffffffffd08;
  allocator local_279;
  string local_278 [32];
  wstring local_258 [32];
  wstring local_238 [36];
  uint local_214;
  uint local_210;
  allocator local_209;
  string local_208 [32];
  int local_1e8;
  allocator local_1e1;
  string local_1e0 [32];
  wstring local_1c0 [32];
  wstring local_1a0 [36];
  int local_17c;
  int local_178;
  allocator local_171;
  string local_170 [39];
  allocator local_149;
  string local_148 [39];
  allocator local_121;
  string local_120 [39];
  allocator local_f9;
  string local_f8 [36];
  ushort local_d4;
  allocator local_d1;
  string local_d0 [36];
  uint local_ac;
  uint local_a8;
  int local_a4;
  int local_a0;
  allocator local_99;
  string local_98 [36];
  uint local_74;
  uint local_70 [5];
  allocator local_59;
  string local_58 [32];
  int local_38;
  int local_34;
  long *local_20;
  long *local_18;
  string *local_10;
  undefined8 local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_34 = ReadVersion(in_stack_fffffffffffffc70);
  local_38 = ReadVersion(in_stack_fffffffffffffc70);
  iVar5 = (int)((ulong)in_stack_fffffffffffffce8 >> 0x20);
  if (local_38 < 0x20001) {
    uVar1 = (**(code **)(*local_18 + 0x18))();
    local_70[0] = (uint)uVar1;
    uVar1 = (**(code **)(*local_20 + 0x18))();
    local_74 = (uint)uVar1;
    if (local_70[0] != local_74) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_98,"ERROR: Feat table - number of features",&local_99);
      OutputError((int *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                  (TestCase *)in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
                  (int)((ulong)in_stack_fffffffffffffce8 >> 0x20));
      std::__cxx11::string::~string(local_98);
      std::allocator<char>::~allocator((allocator<char> *)&local_99);
    }
    (**(code **)(*local_18 + 0x18))();
    (**(code **)(*local_20 + 0x18))();
    (**(code **)(*local_18 + 0x20))();
    (**(code **)(*local_20 + 0x20))();
    local_a0 = 0;
    for (local_a4 = 0; iVar5 = local_a4, piVar6 = std::min<int>((int *)local_70,(int *)&local_74),
        iVar5 < *piVar6; local_a4 = local_a4 + 1) {
      if (local_34 < 0x20000) {
        uVar1 = (**(code **)(*local_18 + 0x18))();
        local_a8 = (uint)uVar1;
      }
      else {
        local_a8 = (**(code **)(*local_18 + 0x20))();
      }
      if (local_38 < 0x20000) {
        uVar1 = (**(code **)(*local_20 + 0x18))();
        local_ac = (uint)uVar1;
      }
      else {
        local_ac = (**(code **)(*local_20 + 0x20))();
      }
      if (local_a8 != local_ac) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_d0,"ERROR: Feat table - feature ID",&local_d1);
        OutputError((int *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                    (TestCase *)in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
                    (int)((ulong)in_stack_fffffffffffffce8 >> 0x20));
        std::__cxx11::string::~string(local_d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_d1);
      }
      uVar1 = (**(code **)(*local_18 + 0x18))();
      local_d4 = uVar1;
      uVar2 = (**(code **)(*local_20 + 0x18))();
      if (uVar1 != uVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_f8,"ERROR: Feat table - feature",&local_f9);
        in_stack_fffffffffffffd08 = &local_121;
        in_stack_fffffffffffffd04 = local_a4;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_120,", number of settings",in_stack_fffffffffffffd08);
        OutputError((int *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                    (TestCase *)in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
                    (int)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                    (string *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc);
        std::__cxx11::string::~string(local_120);
        std::allocator<char>::~allocator((allocator<char> *)&local_121);
        std::__cxx11::string::~string(local_f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_f9);
      }
      local_a0 = (uint)local_d4 + local_a0;
      if (0x1ffff < local_34) {
        (**(code **)(*local_18 + 0x10))();
      }
      if (0x1ffff < local_38) {
        (**(code **)(*local_20 + 0x10))();
      }
      (**(code **)(*local_18 + 0x20))();
      (**(code **)(*local_20 + 0x20))();
      uVar1 = (**(code **)(*local_18 + 0x18))();
      in_stack_fffffffffffffd00 = (uint)uVar1;
      uVar1 = (**(code **)(*local_20 + 0x18))();
      if (in_stack_fffffffffffffd00 != uVar1) {
        in_stack_fffffffffffffcf8 = &local_149;
        in_stack_fffffffffffffce8 = local_8;
        in_stack_fffffffffffffcf0 = local_10;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_148,"ERROR: Feat table - feature",in_stack_fffffffffffffcf8);
        in_stack_fffffffffffffce0 = &local_171;
        in_stack_fffffffffffffcdc = local_a4;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_170,", flags",in_stack_fffffffffffffce0);
        OutputError((int *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                    (TestCase *)in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
                    (int)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                    (string *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc);
        std::__cxx11::string::~string(local_170);
        std::allocator<char>::~allocator((allocator<char> *)&local_171);
        std::__cxx11::string::~string(local_148);
        std::allocator<char>::~allocator((allocator<char> *)&local_149);
      }
      sVar3 = (**(code **)(*local_18 + 0x10))();
      local_178 = (int)sVar3;
      sVar3 = (**(code **)(*local_20 + 0x10))();
      local_17c = (int)sVar3;
      StringFromNameTable_abi_cxx11_
                ((byte *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd04,
                 in_stack_fffffffffffffd00);
      StringFromNameTable_abi_cxx11_
                ((byte *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd04,
                 in_stack_fffffffffffffd00);
      pwVar7 = (wchar_t *)std::__cxx11::wstring::c_str();
      pwVar8 = (wchar_t *)std::__cxx11::wstring::c_str();
      iVar5 = wcscmp(pwVar7,pwVar8);
      if (iVar5 != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1e0,"ERROR: Feat table - label for feature",&local_1e1);
        OutputError((int *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                    (TestCase *)in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
                    (int)((ulong)in_stack_fffffffffffffce8 >> 0x20));
        std::__cxx11::string::~string(local_1e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
      }
      std::__cxx11::wstring::~wstring(local_1c0);
      std::__cxx11::wstring::~wstring(local_1a0);
    }
    if (local_70[0] == local_74) {
      for (local_1e8 = 0; local_1e8 < local_a0; local_1e8 = local_1e8 + 1) {
        sVar3 = (**(code **)(*local_18 + 0x10))();
        sVar4 = (**(code **)(*local_20 + 0x10))();
        if (sVar3 != sVar4) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_208,"ERROR: Feat table - value for setting",&local_209)
          ;
          OutputError((int *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                      (TestCase *)in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
                      (int)((ulong)in_stack_fffffffffffffce8 >> 0x20));
          std::__cxx11::string::~string(local_208);
          std::allocator<char>::~allocator((allocator<char> *)&local_209);
        }
        uVar1 = (**(code **)(*local_18 + 0x18))();
        local_210 = (uint)uVar1;
        uVar1 = (**(code **)(*local_20 + 0x18))();
        local_214 = (uint)uVar1;
        StringFromNameTable_abi_cxx11_
                  ((byte *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd04,
                   in_stack_fffffffffffffd00);
        StringFromNameTable_abi_cxx11_
                  ((byte *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd04,
                   in_stack_fffffffffffffd00);
        pwVar7 = (wchar_t *)std::__cxx11::wstring::c_str();
        pwVar8 = (wchar_t *)std::__cxx11::wstring::c_str();
        iVar5 = wcscmp(pwVar7,pwVar8);
        if (iVar5 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_278,"ERROR: Feat table - label for setting",&local_279)
          ;
          OutputError((int *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                      (TestCase *)in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
                      (int)((ulong)in_stack_fffffffffffffce8 >> 0x20));
          std::__cxx11::string::~string(local_278);
          std::allocator<char>::~allocator((allocator<char> *)&local_279);
        }
        std::__cxx11::wstring::~wstring(local_258);
        std::__cxx11::wstring::~wstring(local_238);
      }
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"ERROR: Feat table - unknown version number",&local_59);
    OutputError((int *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                (TestCase *)in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,iVar5);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
  }
  return;
}

Assistant:

void CompareFeatTables(int & ec, TestCase * ptcase, GrIStream & grstrmB, GrIStream & grstrmT,
	const gr::byte * pNameTblB, const gr::byte * pNameTblT)
{
	int fxdVersionB = ReadVersion(grstrmB);
	int fxdVersionT = ReadVersion(grstrmT);
    Assert(fxdVersionB <= kFeatVersion);
	if (fxdVersionT > kFeatVersion)
	{
		OutputError(ec, ptcase, "ERROR: Feat table - unknown version number");
		return;
	}
	
	//	number of features
	int cfeatB = grstrmB.ReadUShortFromFont();
	int cfeatT = grstrmT.ReadUShortFromFont();
	Assert(cfeatB <= kMaxFeatures);
	if (cfeatB != cfeatT)
		OutputError(ec, ptcase, "ERROR: Feat table - number of features");

	//	reserved
	grstrmB.ReadUShortFromFont();
	grstrmT.ReadUShortFromFont();
	grstrmB.ReadIntFromFont();
	grstrmT.ReadIntFromFont();
	
	int cfset = 0;
	int ifeat;
	for (ifeat = 0; ifeat < min(cfeatB, cfeatT); ifeat++)
	{
		//	ID
		featid nIdB, nIdT;
		if (fxdVersionB >= 0x00020000)
			nIdB = (unsigned int)grstrmB.ReadIntFromFont();
		else
			nIdB = grstrmB.ReadUShortFromFont();
		if (fxdVersionT >= 0x00020000)
			nIdT = (unsigned int)grstrmT.ReadIntFromFont();
		else
			nIdT = grstrmT.ReadUShortFromFont();
		if (nIdB != nIdT)
			OutputError(ec, ptcase, "ERROR: Feat table - feature ID", ifeat);

		//	number of settings
		data16 cfsetThis = grstrmB.ReadUShortFromFont();
		if (cfsetThis != grstrmT.ReadUShortFromFont())
			OutputError(ec, ptcase, "ERROR: Feat table - feature", ifeat, ", number of settings");
		cfset += cfsetThis;

		if (fxdVersionB >= 0x00020000)
			grstrmB.ReadShortFromFont(); // pad bytes
		if (fxdVersionT >= 0x00020000)
			grstrmT.ReadShortFromFont();

		//	offset to settings list
		grstrmB.ReadIntFromFont();
		grstrmT.ReadIntFromFont();

		//	flags
		if (grstrmB.ReadUShortFromFont() != grstrmT.ReadUShortFromFont())
			OutputError(ec, ptcase, "ERROR: Feat table - feature", ifeat, ", flags");

		//	index into name table of UI label
		unsigned int nStrOffsetB = grstrmB.ReadShortFromFont();
		unsigned int nStrOffsetT = grstrmT.ReadShortFromFont();
		std::wstring strB = StringFromNameTable(pNameTblB, 1033, nStrOffsetB);
		std::wstring strT = StringFromNameTable(pNameTblT, 1033, nStrOffsetT);
		if (wcscmp(strB.c_str(), strT.c_str()) != 0)
			OutputError(ec, ptcase, "ERROR: Feat table - label for feature", ifeat);
	}

	if (cfeatB != cfeatT)
		return;

	// setttings
	for (int ifset = 0; ifset < cfset; ifset++)
	{
		if (grstrmB.ReadShortFromFont() != grstrmT.ReadShortFromFont())
			OutputError(ec, ptcase, "ERROR: Feat table - value for setting", ifset);

		// name table offsets
		unsigned int nStrOffsetB = grstrmB.ReadUShortFromFont();
		unsigned int nStrOffsetT = grstrmT.ReadUShortFromFont();
		std::wstring strB = StringFromNameTable(pNameTblB, 1033, nStrOffsetB);
		std::wstring strT = StringFromNameTable(pNameTblT, 1033, nStrOffsetT);
		if (wcscmp(strB.c_str(), strT.c_str()) != 0)
			OutputError(ec, ptcase, "ERROR: Feat table - label for setting", ifset);
	}
}